

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow **data_end;
  int iVar6;
  long lVar7;
  ImGuiContext *g;
  ImGuiWindow **ppIVar8;
  
  pIVar3 = GImGui;
  pIVar1 = window->RootWindow;
  ppIVar2 = (GImGui->Windows).Data;
  iVar6 = (GImGui->Windows).Size;
  ppIVar5 = ppIVar2;
  if (0 < (long)iVar6) {
    do {
      if (*ppIVar5 == pIVar1) break;
      ppIVar5 = ppIVar5 + 1;
    } while (ppIVar5 < ppIVar2 + iVar6);
  }
  ppIVar8 = ppIVar2;
  if (0 < iVar6) {
    do {
      if (*ppIVar8 == behind_window->RootWindow) break;
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 < ppIVar2 + iVar6);
  }
  uVar4 = (uint)((ulong)((long)ppIVar5 - (long)ppIVar2) >> 3);
  iVar6 = (int)((ulong)((long)ppIVar8 - (long)ppIVar2) >> 3);
  if ((int)uVar4 < iVar6) {
    memmove(ppIVar2 + (int)uVar4,ppIVar2 + (long)(int)uVar4 + 1,(long)(int)(iVar6 + ~uVar4) << 3);
    lVar7 = ((long)ppIVar8 - (long)ppIVar2) * 0x20000000 + -0x100000000 >> 0x20;
  }
  else {
    lVar7 = (long)iVar6;
    memmove(ppIVar2 + lVar7 + 1,ppIVar2 + lVar7,(long)(int)(uVar4 - iVar6) << 3);
  }
  (pIVar3->Windows).Data[lVar7] = pIVar1;
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}